

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

opj_bool pi_create_encode(opj_pi_iterator_t *pi,opj_cp_t *cp,int tileno,int pino,int tpnum,int tppos
                         ,J2K_T2_MODE t2_mode,int cur_totnum_tp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  OPJ_PROG_ORDER OVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  opj_tcp_t *poVar7;
  bool bVar8;
  OPJ_UINT32 OVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  byte local_2c [4];
  char prog [4];
  
  poVar7 = cp->tcps;
  pi[pino].first = 1;
  pi[pino].poc.prg = poVar7[tileno].pocs[pino].prg;
  OVar4 = poVar7[tileno].pocs[pino].prg;
  switch(OVar4) {
  case LRCP:
    local_2c[0] = 0x4c;
    local_2c[1] = 0x52;
    local_2c[2] = 0x43;
    local_2c[3] = 0x50;
    break;
  case RLCP:
    local_2c[0] = 0x52;
    local_2c[1] = 0x4c;
    local_2c[2] = 0x43;
    local_2c[3] = 0x50;
    break;
  case RPCL:
    local_2c[0] = 0x52;
    local_2c[1] = 0x50;
    local_2c[2] = 0x43;
    local_2c[3] = 0x4c;
    break;
  case PCRL:
    local_2c[0] = 0x50;
    local_2c[1] = 0x43;
    local_2c[2] = 0x52;
    local_2c[3] = 0x4c;
    break;
  case CPRL:
    local_2c[0] = 0x43;
    local_2c[1] = 0x50;
    local_2c[2] = 0x52;
    local_2c[3] = 0x4c;
    break;
  case PROG_UNKNOWN:
    return 1;
  }
  if ((cp->tp_on == '\0') || ((t2_mode != FINAL_PASS && (cp->cinema == OFF)))) {
    OVar6 = poVar7[tileno].pocs[pino].resS;
    OVar9 = poVar7[tileno].pocs[pino].compS;
    pi[pino].poc.compno1 = poVar7[tileno].pocs[pino].compE;
    pi[pino].poc.layno0 = poVar7[tileno].pocs[pino].layS;
    uVar1 = poVar7[tileno].pocs[pino].layE;
    uVar2 = poVar7[tileno].pocs[pino].resE;
    pi[pino].poc.resno0 = OVar6;
    pi[pino].poc.compno0 = OVar9;
    pi[pino].poc.layno1 = uVar1;
    pi[pino].poc.resno1 = uVar2;
    pi[pino].poc.precno0 = poVar7[tileno].pocs[pino].prcS;
    pi[pino].poc.precno1 = poVar7[tileno].pocs[pino].prcE;
    iVar11 = poVar7[tileno].pocs[pino].txE;
    iVar5 = poVar7[tileno].pocs[pino].tyS;
    iVar13 = poVar7[tileno].pocs[pino].tyE;
    pi[pino].poc.tx0 = poVar7[tileno].pocs[pino].txS;
    pi[pino].poc.tx1 = iVar11;
    pi[pino].poc.ty0 = iVar5;
    pi[pino].poc.ty1 = iVar13;
  }
  else if (tpnum < cur_totnum_tp) {
    lVar12 = (long)tppos;
    bVar8 = true;
    lVar10 = 3;
    do {
      bVar3 = local_2c[lVar10];
      if (bVar3 < 0x50) {
        if (bVar3 == 0x43) {
          if (lVar12 < lVar10) {
            pi[pino].poc.compno0 = poVar7[tileno].pocs[pino].compS;
            pi[pino].poc.compno1 = poVar7[tileno].pocs[pino].compE;
          }
          else if (tpnum == 0) {
            OVar6 = poVar7[tileno].pocs[pino].compS;
            poVar7[tileno].pocs[pino].comp_t = OVar6;
            pi[pino].poc.compno0 = OVar6;
            pi[pino].poc.compno1 = OVar6 + 1;
            poVar7[tileno].pocs[pino].comp_t = OVar6 + 1;
          }
          else {
            if (bVar8) {
              OVar6 = poVar7[tileno].pocs[pino].comp_t;
              if (OVar6 == poVar7[tileno].pocs[pino].compE) {
                OVar6 = poVar7[tileno].pocs[pino].compS;
                poVar7[tileno].pocs[pino].comp_t = OVar6;
                pi[pino].poc.compno0 = OVar6;
                pi[pino].poc.compno1 = OVar6 + 1;
                poVar7[tileno].pocs[pino].comp_t = OVar6 + 1;
LAB_0012fa9f:
                bVar8 = true;
                goto LAB_0012fc80;
              }
              pi[pino].poc.compno0 = OVar6;
              pi[pino].poc.compno1 = OVar6 + 1;
              poVar7[tileno].pocs[pino].comp_t = OVar6 + 1;
            }
            else {
              OVar6 = poVar7[tileno].pocs[pino].comp_t;
              pi[pino].poc.compno0 = OVar6 - 1;
              pi[pino].poc.compno1 = OVar6;
            }
LAB_0012fc7e:
            bVar8 = false;
          }
        }
        else if (bVar3 == 0x4c) {
          if (lVar12 < lVar10) {
            pi[pino].poc.layno0 = poVar7[tileno].pocs[pino].layS;
            pi[pino].poc.layno1 = poVar7[tileno].pocs[pino].layE;
          }
          else {
            if (tpnum != 0) {
              if (bVar8) {
                iVar11 = poVar7[tileno].pocs[pino].lay_t;
                if (iVar11 == poVar7[tileno].pocs[pino].layE) {
                  iVar11 = poVar7[tileno].pocs[pino].layS;
                  poVar7[tileno].pocs[pino].lay_t = iVar11;
                  pi[pino].poc.layno0 = iVar11;
                  pi[pino].poc.layno1 = iVar11 + 1U;
                  poVar7[tileno].pocs[pino].lay_t = iVar11 + 1U;
                  goto LAB_0012fa9f;
                }
                pi[pino].poc.layno0 = iVar11;
                pi[pino].poc.layno1 = iVar11 + 1U;
                poVar7[tileno].pocs[pino].lay_t = iVar11 + 1U;
              }
              else {
                OVar6 = poVar7[tileno].pocs[pino].lay_t;
                pi[pino].poc.layno0 = OVar6 - 1;
                pi[pino].poc.layno1 = OVar6;
              }
              goto LAB_0012fc7e;
            }
            iVar11 = poVar7[tileno].pocs[pino].layS;
            poVar7[tileno].pocs[pino].lay_t = iVar11;
            pi[pino].poc.layno0 = iVar11;
            pi[pino].poc.layno1 = iVar11 + 1U;
            poVar7[tileno].pocs[pino].lay_t = iVar11 + 1U;
          }
        }
      }
      else if (bVar3 == 0x50) {
        if ((uint)OVar4 < 2) {
          if (lVar12 < lVar10) {
            pi[pino].poc.precno0 = poVar7[tileno].pocs[pino].prcS;
            pi[pino].poc.precno1 = poVar7[tileno].pocs[pino].prcE;
          }
          else {
            if (tpnum != 0) {
              if (bVar8) {
                iVar11 = poVar7[tileno].pocs[pino].prc_t;
                if (iVar11 == poVar7[tileno].pocs[pino].prcE) {
                  iVar11 = poVar7[tileno].pocs[pino].prcS;
                  poVar7[tileno].pocs[pino].prc_t = iVar11;
                  pi[pino].poc.precno0 = iVar11;
                  pi[pino].poc.precno1 = iVar11 + 1;
                  poVar7[tileno].pocs[pino].prc_t = iVar11 + 1;
                  goto LAB_0012fa9f;
                }
                pi[pino].poc.precno0 = iVar11;
                pi[pino].poc.precno1 = iVar11 + 1;
                poVar7[tileno].pocs[pino].prc_t = iVar11 + 1;
              }
              else {
                iVar11 = poVar7[tileno].pocs[pino].prc_t;
                pi[pino].poc.precno0 = iVar11 + -1;
                pi[pino].poc.precno1 = iVar11;
              }
              goto LAB_0012fc7e;
            }
            iVar11 = poVar7[tileno].pocs[pino].prcS;
            poVar7[tileno].pocs[pino].prc_t = iVar11;
            pi[pino].poc.precno0 = iVar11;
            pi[pino].poc.precno1 = iVar11 + 1;
            poVar7[tileno].pocs[pino].prc_t = iVar11 + 1;
          }
        }
        else if (lVar12 < lVar10) {
          iVar11 = poVar7[tileno].pocs[pino].txE;
          iVar5 = poVar7[tileno].pocs[pino].tyS;
          iVar13 = poVar7[tileno].pocs[pino].tyE;
          pi[pino].poc.tx0 = poVar7[tileno].pocs[pino].txS;
          pi[pino].poc.tx1 = iVar11;
          pi[pino].poc.ty0 = iVar5;
          pi[pino].poc.ty1 = iVar13;
        }
        else {
          if (tpnum != 0) {
            if (bVar8) {
              iVar11 = poVar7[tileno].pocs[pino].tx0_t;
              if (poVar7[tileno].pocs[pino].txE <= iVar11) {
                iVar11 = poVar7[tileno].pocs[pino].ty0_t;
                bVar8 = poVar7[tileno].pocs[pino].tyE <= iVar11;
                if (bVar8) {
                  iVar11 = poVar7[tileno].pocs[pino].tyS;
                  poVar7[tileno].pocs[pino].ty0_t = iVar11;
                  pi[pino].poc.ty0 = iVar11;
                }
                else {
                  pi[pino].poc.ty0 = iVar11;
                }
                iVar5 = poVar7[tileno].pocs[pino].dy;
                iVar11 = (iVar5 + iVar11) - iVar11 % iVar5;
                pi[pino].poc.ty1 = iVar11;
                poVar7[tileno].pocs[pino].ty0_t = iVar11;
                iVar11 = poVar7[tileno].pocs[pino].txS;
                poVar7[tileno].pocs[pino].tx0_t = iVar11;
                pi[pino].poc.tx0 = iVar11;
                iVar5 = poVar7[tileno].pocs[pino].dx;
                iVar11 = (iVar5 + iVar11) - iVar11 % iVar5;
                pi[pino].poc.tx1 = iVar11;
                poVar7[tileno].pocs[pino].tx0_t = iVar11;
                goto LAB_0012fc80;
              }
              pi[pino].poc.tx0 = iVar11;
              iVar5 = poVar7[tileno].pocs[pino].dx;
              iVar11 = (iVar5 + iVar11) - iVar11 % iVar5;
              pi[pino].poc.tx1 = iVar11;
              poVar7[tileno].pocs[pino].tx0_t = iVar11;
            }
            else {
              iVar11 = poVar7[tileno].pocs[pino].dx;
              iVar5 = poVar7[tileno].pocs[pino].tx0_t;
              pi[pino].poc.tx0 = iVar5 - (iVar5 % iVar11 + iVar11);
              pi[pino].poc.tx1 = iVar5;
            }
            iVar11 = poVar7[tileno].pocs[pino].dy;
            iVar5 = poVar7[tileno].pocs[pino].ty0_t;
            pi[pino].poc.ty0 = iVar5 - (iVar5 % iVar11 + iVar11);
            pi[pino].poc.ty1 = iVar5;
            goto LAB_0012fc7e;
          }
          iVar11 = poVar7[tileno].pocs[pino].txS;
          iVar5 = poVar7[tileno].pocs[pino].tyS;
          poVar7[tileno].pocs[pino].tx0_t = iVar11;
          poVar7[tileno].pocs[pino].ty0_t = iVar5;
          pi[pino].poc.tx0 = iVar11;
          iVar13 = poVar7[tileno].pocs[pino].dx;
          iVar13 = (iVar13 + iVar11) - iVar11 % iVar13;
          pi[pino].poc.tx1 = iVar13;
          pi[pino].poc.ty0 = iVar5;
          iVar11 = poVar7[tileno].pocs[pino].dy;
          iVar11 = (iVar11 + iVar5) - iVar5 % iVar11;
          pi[pino].poc.ty1 = iVar11;
          poVar7[tileno].pocs[pino].tx0_t = iVar13;
          poVar7[tileno].pocs[pino].ty0_t = iVar11;
        }
      }
      else if (bVar3 == 0x52) {
        if (lVar12 < lVar10) {
          pi[pino].poc.resno0 = poVar7[tileno].pocs[pino].resS;
          pi[pino].poc.resno1 = poVar7[tileno].pocs[pino].resE;
        }
        else {
          if (tpnum != 0) {
            if (bVar8) {
              OVar6 = poVar7[tileno].pocs[pino].res_t;
              if (OVar6 == poVar7[tileno].pocs[pino].resE) {
                OVar6 = poVar7[tileno].pocs[pino].resS;
                poVar7[tileno].pocs[pino].res_t = OVar6;
                pi[pino].poc.resno0 = OVar6;
                pi[pino].poc.resno1 = OVar6 + 1;
                poVar7[tileno].pocs[pino].res_t = OVar6 + 1;
                goto LAB_0012fa9f;
              }
              pi[pino].poc.resno0 = OVar6;
              pi[pino].poc.resno1 = OVar6 + 1;
              poVar7[tileno].pocs[pino].res_t = OVar6 + 1;
            }
            else {
              OVar6 = poVar7[tileno].pocs[pino].res_t;
              pi[pino].poc.resno0 = OVar6 - 1;
              pi[pino].poc.resno1 = OVar6;
            }
            goto LAB_0012fc7e;
          }
          OVar6 = poVar7[tileno].pocs[pino].resS;
          poVar7[tileno].pocs[pino].res_t = OVar6;
          pi[pino].poc.resno0 = OVar6;
          pi[pino].poc.resno1 = OVar6 + 1;
          poVar7[tileno].pocs[pino].res_t = OVar6 + 1;
        }
      }
LAB_0012fc80:
      bVar14 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar14);
  }
  return 0;
}

Assistant:

opj_bool pi_create_encode( opj_pi_iterator_t *pi, opj_cp_t *cp,int tileno, int pino,int tpnum, int tppos, J2K_T2_MODE t2_mode,int cur_totnum_tp){
	char prog[4];
	int i;
	int incr_top=1,resetX=0;
	opj_tcp_t *tcps =&cp->tcps[tileno];
	opj_poc_t *tcp= &tcps->pocs[pino];

	pi[pino].first = 1;
	pi[pino].poc.prg = tcp->prg;

	switch(tcp->prg){
		case CPRL: strncpy(prog, "CPRL",4);
			break;
		case LRCP: strncpy(prog, "LRCP",4);
			break;
		case PCRL: strncpy(prog, "PCRL",4);
			break;
		case RLCP: strncpy(prog, "RLCP",4);
			break;
		case RPCL: strncpy(prog, "RPCL",4);
			break;
		case PROG_UNKNOWN: 
			return OPJ_TRUE;
	}

	if(!(cp->tp_on && ((!cp->cinema && (t2_mode == FINAL_PASS)) || cp->cinema))){
		pi[pino].poc.resno0 = tcp->resS;
		pi[pino].poc.resno1 = tcp->resE;
		pi[pino].poc.compno0 = tcp->compS;
		pi[pino].poc.compno1 = tcp->compE;
		pi[pino].poc.layno0 = tcp->layS;
		pi[pino].poc.layno1 = tcp->layE;
		pi[pino].poc.precno0 = tcp->prcS;
		pi[pino].poc.precno1 = tcp->prcE;
		pi[pino].poc.tx0 = tcp->txS;
		pi[pino].poc.ty0 = tcp->tyS;
		pi[pino].poc.tx1 = tcp->txE;
		pi[pino].poc.ty1 = tcp->tyE;
	}else {
		if( tpnum < cur_totnum_tp){
			for(i=3;i>=0;i--){
				switch(prog[i]){
				case 'C':
					if (i > tppos){
						pi[pino].poc.compno0 = tcp->compS;
						pi[pino].poc.compno1 = tcp->compE;
					}else{
						if (tpnum == 0){
							tcp->comp_t = tcp->compS;
							pi[pino].poc.compno0 = tcp->comp_t;
							pi[pino].poc.compno1 = tcp->comp_t+1;
							tcp->comp_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->comp_t ==tcp->compE){
									tcp->comp_t = tcp->compS;
									pi[pino].poc.compno0 = tcp->comp_t;
									pi[pino].poc.compno1 = tcp->comp_t+1;
									tcp->comp_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.compno0 = tcp->comp_t;
									pi[pino].poc.compno1 = tcp->comp_t+1;
									tcp->comp_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.compno0 = tcp->comp_t-1;
								pi[pino].poc.compno1 = tcp->comp_t;
							}
						}
					}
					break;

				case 'R':
					if (i > tppos){
						pi[pino].poc.resno0 = tcp->resS;
						pi[pino].poc.resno1 = tcp->resE;
					}else{
						if (tpnum == 0){
							tcp->res_t = tcp->resS;
							pi[pino].poc.resno0 = tcp->res_t;
							pi[pino].poc.resno1 = tcp->res_t+1;
							tcp->res_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->res_t==tcp->resE){
									tcp->res_t = tcp->resS;
									pi[pino].poc.resno0 = tcp->res_t;
									pi[pino].poc.resno1 = tcp->res_t+1;
									tcp->res_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.resno0 = tcp->res_t;
									pi[pino].poc.resno1 = tcp->res_t+1;
									tcp->res_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.resno0 = tcp->res_t - 1;
								pi[pino].poc.resno1 = tcp->res_t;
							}
						}
					}
					break;

				case 'L':
					if (i > tppos){
						pi[pino].poc.layno0 = tcp->layS;
						pi[pino].poc.layno1 = tcp->layE;
					}else{
						if (tpnum == 0){
							tcp->lay_t = tcp->layS;
							pi[pino].poc.layno0 = tcp->lay_t;
							pi[pino].poc.layno1 = tcp->lay_t+1;
							tcp->lay_t+=1;
						}else{
							if (incr_top == 1){
								if(tcp->lay_t == tcp->layE){
									tcp->lay_t = tcp->layS;
									pi[pino].poc.layno0 = tcp->lay_t;
									pi[pino].poc.layno1 = tcp->lay_t+1;
									tcp->lay_t+=1;
									incr_top=1;
								}else{
									pi[pino].poc.layno0 = tcp->lay_t;
									pi[pino].poc.layno1 = tcp->lay_t+1;
									tcp->lay_t+=1;
									incr_top=0;
								}
							}else{
								pi[pino].poc.layno0 = tcp->lay_t - 1;
								pi[pino].poc.layno1 = tcp->lay_t;
							}
						}
					}
					break;

				case 'P':
					switch(tcp->prg){
						case LRCP:
						case RLCP:
							if (i > tppos){
								pi[pino].poc.precno0 = tcp->prcS;
								pi[pino].poc.precno1 = tcp->prcE;
							}else{
								if (tpnum == 0){
									tcp->prc_t = tcp->prcS;
									pi[pino].poc.precno0 = tcp->prc_t;
									pi[pino].poc.precno1 = tcp->prc_t+1;
									tcp->prc_t+=1; 
								}else{
									if (incr_top == 1){
										if(tcp->prc_t == tcp->prcE){
											tcp->prc_t = tcp->prcS;
											pi[pino].poc.precno0 = tcp->prc_t;
											pi[pino].poc.precno1 = tcp->prc_t+1;
											tcp->prc_t+=1;
											incr_top=1;
										}else{
											pi[pino].poc.precno0 = tcp->prc_t;
											pi[pino].poc.precno1 = tcp->prc_t+1;
											tcp->prc_t+=1;
											incr_top=0;
										}
									}else{
										pi[pino].poc.precno0 = tcp->prc_t - 1;
										pi[pino].poc.precno1 = tcp->prc_t;
									}
								}
							}
						break;
						default:
							if (i > tppos){
								pi[pino].poc.tx0 = tcp->txS;
								pi[pino].poc.ty0 = tcp->tyS;
								pi[pino].poc.tx1 = tcp->txE;
								pi[pino].poc.ty1 = tcp->tyE;
							}else{
								if (tpnum == 0){
									tcp->tx0_t = tcp->txS;
									tcp->ty0_t = tcp->tyS;
									pi[pino].poc.tx0 = tcp->tx0_t;
									pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
									pi[pino].poc.ty0 = tcp->ty0_t;
									pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
									tcp->tx0_t = pi[pino].poc.tx1;
									tcp->ty0_t = pi[pino].poc.ty1;
								}else{
									if (incr_top == 1){
										if(tcp->tx0_t >= tcp->txE){
											if(tcp->ty0_t >= tcp->tyE){
												tcp->ty0_t = tcp->tyS;
												pi[pino].poc.ty0 = tcp->ty0_t;
												pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
												tcp->ty0_t = pi[pino].poc.ty1;
												incr_top=1;resetX=1;
											}else{
												pi[pino].poc.ty0 = tcp->ty0_t;
												pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
												tcp->ty0_t = pi[pino].poc.ty1;
												incr_top=0;resetX=1;
											}
											if(resetX==1){
												tcp->tx0_t = tcp->txS;
												pi[pino].poc.tx0 = tcp->tx0_t;
												pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx- (tcp->tx0_t % tcp->dx);
												tcp->tx0_t = pi[pino].poc.tx1;
											}
										}else{
											pi[pino].poc.tx0 = tcp->tx0_t;
											pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx- (tcp->tx0_t % tcp->dx);
											tcp->tx0_t = pi[pino].poc.tx1;
											pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
											pi[pino].poc.ty1 = tcp->ty0_t ;
											incr_top=0;
										}
									}else{
										pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
										pi[pino].poc.tx1 = tcp->tx0_t ;
										pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
										pi[pino].poc.ty1 = tcp->ty0_t ;
									}
								}
							}
						break;
						}
						break;
				}		
			} 
		}
	}	
	return OPJ_FALSE;
}